

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseText(TidyDocImpl *doc,Node *field,GetTokenMode mode)

{
  Bool BVar1;
  Node *node_00;
  Node *node;
  Lexer *lexer;
  GetTokenMode mode_local;
  Node *field_local;
  TidyDocImpl *doc_local;
  
  doc->lexer->insert = (IStack *)0x0;
  if (((field == (Node *)0x0) || (field->tag == (Dict *)0x0)) ||
     (field->tag->id != TidyTag_TEXTAREA)) {
    lexer._4_4_ = MixedContent;
  }
  else {
    lexer._4_4_ = Preformatted;
  }
  while( true ) {
    node_00 = prvTidyGetToken(doc,lexer._4_4_);
    if (node_00 == (Node *)0x0) {
      if ((field->tag->model & 0x8000) == 0) {
        prvTidyReport(doc,field,(Node *)0x0,0x25a);
      }
      return;
    }
    if ((node_00->tag == field->tag) && (node_00->type == EndTag)) break;
    BVar1 = InsertMisc(field,node_00);
    if (BVar1 == no) {
      BVar1 = prvTidynodeIsText(node_00);
      if (BVar1 == no) {
        if (((node_00->tag == (Dict *)0x0) || ((node_00->tag->model & 0x10) == 0)) ||
           ((node_00->tag->model & 0x400) != 0)) {
          if ((field->tag->model & 0x8000) == 0) {
            prvTidyReport(doc,field,node_00,0x259);
          }
          prvTidyUngetToken(doc);
          TrimSpaces(doc,field);
          return;
        }
        prvTidyReport(doc,field,node_00,0x235);
        prvTidyFreeNode(doc,node_00);
      }
      else {
        if ((field->content == (Node *)0x0) && ((lexer._4_4_ & Preformatted) == IgnoreWhitespace)) {
          TrimSpaces(doc,field);
        }
        if (node_00->start < node_00->end) {
          prvTidyInsertNodeAtEnd(field,node_00);
        }
        else {
          prvTidyFreeNode(doc,node_00);
        }
      }
    }
  }
  prvTidyFreeNode(doc,node_00);
  field->closed = yes;
  TrimSpaces(doc,field);
  return;
}

Assistant:

void TY_(ParseText)(TidyDocImpl* doc, Node *field, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node;

    lexer->insert = NULL;  /* defer implicit inline start tags */

    if ( nodeIsTEXTAREA(field) )
        mode = Preformatted;
    else
        mode = MixedContent;  /* kludge for font tags */

    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        if (node->tag == field->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            field->closed = yes;
            TrimSpaces(doc, field);
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(field, node))
            continue;

        if (TY_(nodeIsText)(node))
        {
            /* only called for 1st child */
            if (field->content == NULL && !(mode & Preformatted))
                TrimSpaces(doc, field);

            if (node->start >= node->end)
            {
                TY_(FreeNode)( doc, node);
                continue;
            }

            TY_(InsertNodeAtEnd)(field, node);
            continue;
        }

        /* for textarea should all cases of < and & be escaped? */

        /* discard inline tags e.g. font */
        if (   node->tag 
            && node->tag->model & CM_INLINE
            && !(node->tag->model & CM_FIELD)) /* #487283 - fix by Lee Passey 25 Jan 02 */
        {
            TY_(Report)(doc, field, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* terminate element on other tags */
        if (!(field->tag->model & CM_OPT))
            TY_(Report)(doc, field, node, MISSING_ENDTAG_BEFORE);

        TY_(UngetToken)( doc );
        TrimSpaces(doc, field);
        return;
    }

    if (!(field->tag->model & CM_OPT))
        TY_(Report)(doc, field, node, MISSING_ENDTAG_FOR);
}